

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::TimestampTest::TimestampTest
          (TimestampTest *this,TestContext *testContext,string *name,string *description,
          TimestampTestParam *param)

{
  bool bVar1;
  TimestampTestParam *param_local;
  string *description_local;
  string *name_local;
  TestContext *testContext_local;
  TimestampTest *this_local;
  
  TestCase::TestCase(&this->super_TestCase,testContext,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TimestampTest_016a2c90;
  TimestampTestParam::getStageVector(&this->m_stages,param);
  bVar1 = TimestampTestParam::getInRenderPass(param);
  this->m_inRenderPass = bVar1;
  return;
}

Assistant:

TimestampTest(tcu::TestContext&         testContext,
										const std::string&        name,
										const std::string&        description,
										const TimestampTestParam* param)
							  : vkt::TestCase  (testContext, name, description)
							  , m_stages       (param->getStageVector())
							  , m_inRenderPass (param->getInRenderPass())
							  { }